

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_writer.cxx
# Opt level: O0

void __thiscall
xray_re::xr_writer::w_raw_chunk(xr_writer *this,uint32_t id,void *data,size_t size,bool compress)

{
  size_t local_40;
  size_t compressed_size;
  uint8_t *compressed_data;
  size_t sStack_28;
  bool compress_local;
  size_t size_local;
  void *data_local;
  xr_writer *pxStack_10;
  uint32_t id_local;
  xr_writer *this_local;
  
  compressed_data._7_1_ = compress;
  sStack_28 = size;
  size_local = (size_t)data;
  data_local._4_4_ = id;
  pxStack_10 = this;
  if (compress) {
    xr_lzhuf::compress((uint8_t **)&compressed_size,&local_40,(uint8_t *)data,size);
    w_u32(this,data_local._4_4_ | 0x80000000);
    w_size_u32(this,local_40);
    (*this->_vptr_xr_writer[2])(this,compressed_size,local_40);
    free((void *)compressed_size);
  }
  else {
    w_u32(this,id);
    w_size_u32(this,sStack_28);
    (*this->_vptr_xr_writer[2])(this,size_local,sStack_28);
  }
  return;
}

Assistant:

void xr_writer::w_raw_chunk(uint32_t id, const void* data, size_t size, bool compress)
{
	if (compress)
	{
		uint8_t* compressed_data;
		size_t compressed_size;
		xr_lzhuf::compress(compressed_data, compressed_size, (const uint8_t*)data, size);

		w_u32(id|xr_reader::CHUNK_COMPRESSED);
		w_size_u32(compressed_size);
		w_raw(compressed_data, compressed_size);

		free(compressed_data);
	}
	else
	{
		w_u32(id);
		w_size_u32(size);
		w_raw(data, size);
	}
}